

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  uint uVar1;
  int iVar2;
  char *__s;
  int iVar3;
  uint uVar4;
  FORM *form_00;
  FIELD *field;
  FIELD *pFVar5;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int p1_03;
  int p1_04;
  int p1_05;
  int p1_06;
  int p1_07;
  int p1_08;
  int local_17c;
  int local_154;
  int local_118;
  int local_114;
  FIELD *cur;
  allocator<char> local_e9;
  string local_e8;
  char local_c8 [8];
  char debugMessage [128];
  FORM *form;
  int y;
  int x;
  WINDOW *w_local;
  cmCursesMainForm *fm_local;
  int *key_local;
  cmCursesStringWidget *this_local;
  
  form_00 = cmCursesForm::GetForm(&fm->super_cmCursesForm);
  if ((((((this->super_cmCursesWidget).field_0x3c & 1) == 0) && (*key != 10)) && (*key != 0x157)) &&
     (*key != 0x69)) {
    return false;
  }
  this->OriginalString = (char *)0x0;
  this->Done = false;
  do {
    while( true ) {
      if (((this->Done ^ 0xffU) & 1) == 0) {
        return true;
      }
      sprintf(local_c8,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(local_c8);
      iVar3 = 0;
      cmCursesMainForm::PrintKeys(fm,0);
      if (_stdscr == 0) {
        local_114 = -1;
        local_118 = -1;
      }
      else {
        local_114 = *(short *)(_stdscr + 4) + 1;
        local_118 = *(short *)(_stdscr + 6) + 1;
      }
      if ((0x40 < local_118) && (5 < local_114)) break;
      if (*key == 0x71) {
        return false;
      }
      iVar3 = wgetch(_stdscr);
      *key = iVar3;
    }
    if (((((this->super_cmCursesWidget).field_0x3c & 1) == 0) && (*key != 10)) &&
       ((*key != 0x157 && (*key != 0x69)))) {
      return false;
    }
    if ((((this->super_cmCursesWidget).field_0x3c & 1) == 0) &&
       (((*key == 10 || (*key == 0x157)) || (*key == 0x69)))) {
      (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
    }
    else if ((((this->super_cmCursesWidget).field_0x3c & 1) == 0) ||
            ((*key != 10 && (*key != 0x157)))) {
      if (*key == 0x102) {
LAB_0014c7fd:
        (this->super_cmCursesWidget).field_0x3c = 0;
        if (this->OriginalString != (char *)0x0) {
          operator_delete__(this->OriginalString);
        }
        form_driver(form_00,0x204);
        form_driver(form_00,0x205);
        return false;
      }
      uVar1 = *key;
      uVar4 = ctrl((EVP_PKEY_CTX *)0x6e,iVar3,p1,&stdscr);
      if ((uVar1 == uVar4) || (*key == 0x103)) goto LAB_0014c7fd;
      uVar1 = *key;
      uVar4 = ctrl((EVP_PKEY_CTX *)0x70,iVar3,p1_00,(void *)(ulong)uVar4);
      if ((uVar1 == uVar4) || (*key == 0x152)) goto LAB_0014c7fd;
      uVar1 = *key;
      uVar4 = ctrl((EVP_PKEY_CTX *)0x64,iVar3,p1_01,(void *)(ulong)uVar4);
      if ((uVar1 == uVar4) || (*key == 0x153)) goto LAB_0014c7fd;
      uVar1 = *key;
      uVar4 = ctrl((EVP_PKEY_CTX *)0x75,iVar3,p1_02,(void *)(ulong)uVar4);
      if (uVar1 == uVar4) goto LAB_0014c7fd;
      if (*key == 0x1b) {
        if (((this->super_cmCursesWidget).field_0x3c & 1) != 0) {
          (this->super_cmCursesWidget).field_0x3c = 0;
          cmCursesMainForm::PrintKeys(fm,0);
          __s = this->OriginalString;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_e9);
          SetString(this,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          if (this->OriginalString != (char *)0x0) {
            operator_delete__(this->OriginalString);
          }
          if (w == (WINDOW *)0x0) {
            local_154 = -1;
          }
          else {
            local_154 = w->_maxy + 1;
          }
          wtouchln(w,0,local_154,1);
          wrefresh(w);
          return true;
        }
      }
      else if (*key == 9) {
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
      }
      else {
        if (*key != 0x104) {
          uVar1 = *key;
          uVar4 = ctrl((EVP_PKEY_CTX *)0x62,iVar3,p1_03,(void *)(ulong)uVar4);
          if (uVar1 != uVar4) {
            if (*key != 0x105) {
              uVar1 = *key;
              uVar4 = ctrl((EVP_PKEY_CTX *)0x66,iVar3,p1_04,(void *)(ulong)uVar4);
              if (uVar1 != uVar4) {
                uVar1 = *key;
                uVar4 = ctrl((EVP_PKEY_CTX *)0x6b,iVar3,p1_05,(void *)(ulong)uVar4);
                if (uVar1 == uVar4) {
                  form_driver(form_00,0x225);
                }
                else {
                  uVar1 = *key;
                  uVar4 = ctrl((EVP_PKEY_CTX *)0x61,iVar3,p1_06,(void *)(ulong)uVar4);
                  if ((uVar1 == uVar4) || (*key == 0x106)) {
                    form_driver(form_00,0x216);
                  }
                  else {
                    uVar1 = *key;
                    uVar4 = ctrl((EVP_PKEY_CTX *)0x65,iVar3,p1_07,(void *)(ulong)uVar4);
                    if ((uVar1 == uVar4) || (*key == 0x168)) {
                      form_driver(form_00,0x217);
                    }
                    else if ((*key == 0x7f) || (*key == 0x107)) {
                      field = current_field(form_00);
                      form_driver(form_00,0x222);
                      pFVar5 = current_field(form_00);
                      if (pFVar5 != field) {
                        set_current_field(form_00,field);
                      }
                    }
                    else {
                      iVar2 = *key;
                      iVar3 = ctrl((EVP_PKEY_CTX *)0x64,iVar3,p1_08,(void *)(ulong)uVar4);
                      if ((iVar2 == iVar3) || (*key == 0x14a)) {
                        form_driver(form_00,0x221);
                      }
                      else {
                        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
                      }
                    }
                  }
                }
                goto LAB_0014cbd6;
              }
            }
            form_driver(form_00,0x210);
            goto LAB_0014cbd6;
          }
        }
        form_driver(form_00,0x211);
      }
    }
    else {
      (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
    }
LAB_0014cbd6:
    if ((this->Done & 1U) == 0) {
      if (w == (WINDOW *)0x0) {
        local_17c = -1;
      }
      else {
        local_17c = w->_maxy + 1;
      }
      wtouchln(w,0,local_17c,1);
      wrefresh(w);
      iVar3 = wgetch(_stdscr);
      *key = iVar3;
    }
  } while( true );
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x, y;

  FORM* form = fm->GetForm();
  // when not in edit mode, edit mode is entered by pressing enter or i (vim
  // binding)
  // 10 == enter
  if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
    return false;
  }

  this->OriginalString = nullptr;
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while (!this->Done) {
    sprintf(debugMessage, "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        return false;
      }
      key = getch();
      continue;
    }

    // If resize occurred during edit, move out of edit mode
    if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
      return false;
    }
    // enter edit with return and i (vim binding)
    if (!this->InEdit && (key == 10 || key == KEY_ENTER || key == 'i')) {
      this->OnReturn(fm, w);
    }
    // leave edit with return (but not i -- not a toggle)
    else if (this->InEdit && (key == 10 || key == KEY_ENTER)) {
      this->OnReturn(fm, w);
    } else if (key == KEY_DOWN || key == ctrl('n') || key == KEY_UP ||
               key == ctrl('p') || key == KEY_NPAGE || key == ctrl('d') ||
               key == KEY_PPAGE || key == ctrl('u')) {
      this->InEdit = false;
      delete[] this->OriginalString;
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
    }
    // esc
    else if (key == 27) {
      if (this->InEdit) {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        delete[] this->OriginalString;
        touchwin(w);
        wrefresh(w);
        return true;
      }
    } else if (key == 9) {
      this->OnTab(fm, w);
    } else if (key == KEY_LEFT || key == ctrl('b')) {
      form_driver(form, REQ_PREV_CHAR);
    } else if (key == KEY_RIGHT || key == ctrl('f')) {
      form_driver(form, REQ_NEXT_CHAR);
    } else if (key == ctrl('k')) {
      form_driver(form, REQ_CLR_EOL);
    } else if (key == ctrl('a') || key == KEY_HOME) {
      form_driver(form, REQ_BEG_FIELD);
    } else if (key == ctrl('e') || key == KEY_END) {
      form_driver(form, REQ_END_FIELD);
    } else if (key == 127 || key == KEY_BACKSPACE) {
      FIELD* cur = current_field(form);
      form_driver(form, REQ_DEL_PREV);
      if (current_field(form) != cur) {
        set_current_field(form, cur);
      }
    } else if (key == ctrl('d') || key == KEY_DC) {
      form_driver(form, REQ_DEL_CHAR);
    } else {
      this->OnType(key, fm, w);
    }
    if (!this->Done) {
      touchwin(w);
      wrefresh(w);

      key = getch();
    }
  }
  return true;
}